

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

LengthData qvariant_cast<QCss::LengthData>(QVariant *v)

{
  PrivateShared *pPVar1;
  bool bVar2;
  QMetaType QVar3;
  long in_FS_OFFSET;
  LengthData LVar4;
  LengthData t;
  QMetaType local_38;
  QMetaType local_30;
  PrivateShared *local_28;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QCss::LengthData>::metaType;
  local_38.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
  bVar2 = comparesEqual(&local_38,&local_30);
  if (bVar2) {
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
    }
    local_28 = (((Private *)&((PrivateShared *)v)->field_0x0)->data).shared;
    uStack_20 = (undefined4)*(undefined8 *)&((PrivateShared *)((long)v + 8))->field_0x0;
    uStack_1c = (undefined4)
                ((ulong)*(undefined8 *)&((PrivateShared *)((long)v + 8))->field_0x0 >> 0x20);
  }
  else {
    local_28 = (PrivateShared *)0x0;
    uStack_20 = 0;
    uStack_1c = 0;
    QVar3.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
    }
    QMetaType::convert(QVar3,v,local_30,&local_28);
  }
  LVar4.unit = uStack_20;
  LVar4.number = (qreal)local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    LVar4._12_4_ = 0;
    return LVar4;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}